

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

DWORD * __thiscall ExportEntryWrapper::getFuncRvaPtr(ExportEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  IMAGE_EXPORT_DIRECTORY *pIVar3;
  undefined4 extraout_var;
  
  if (this->parentDir != (ExportDirWrapper *)0x0) {
    pIVar3 = ExportDirWrapper::exportDir(this->parentDir);
    if (pIVar3 != (IMAGE_EXPORT_DIRECTORY *)0x0) {
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,(ulong)pIVar3->AddressOfFunctions +
                                (this->super_ExeNodeWrapper).entryNum * 4,2,4,0);
      return (DWORD *)CONCAT44(extraout_var,iVar2);
    }
  }
  return (DWORD *)0x0;
}

Assistant:

DWORD* ExportEntryWrapper::getFuncRvaPtr()
{
    if (this->parentDir == NULL) return NULL;
    IMAGE_EXPORT_DIRECTORY* exp = parentDir->exportDir();
    if (exp == NULL) return NULL;

    uint64_t funcRva = exp->AddressOfFunctions;
    funcRva += (this->entryNum * sizeof(DWORD));

    DWORD *ptr =  (DWORD*) m_Exe->getContentAt(funcRva, Executable::RVA, sizeof(DWORD));
    return ptr;
}